

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O1

void __thiscall
ear::OutputGainMat::write_mat<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (OutputGainMat *this,Matrix<double,__1,__1,_0,__1,__1> *mat)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  (**this->_vptr_OutputGainMat)
            (this,(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_rows,
             (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols);
  if ((mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      if (uVar1 != 0) {
        uVar2 = 0;
        do {
          if ((((long)uVar4 < 0) || ((long)uVar1 <= (long)uVar2)) ||
             ((mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols <= (long)uVar4)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          (*this->_vptr_OutputGainMat[3])
                    (*(undefined8 *)
                      ((long)(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                             .m_storage.m_data + uVar2 * 8 + uVar1 * lVar3),this,uVar2,uVar4);
          uVar2 = uVar2 + 1;
          uVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_rows;
        } while (uVar2 < uVar1);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar4 < (ulong)(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_cols);
  }
  return;
}

Assistant:

void write_mat(T mat) {
      check_size(mat.rows(), mat.cols());
      for (size_t col = 0; col < (size_t)mat.cols(); col++)
        for (size_t row = 0; row < (size_t)mat.rows(); row++)
          write(row, col, mat(row, col));
    }